

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O3

void mcode_allocarea(jit_State *J)

{
  MCode *pMVar1;
  MCode *__addr;
  long *base;
  uint64_t uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  int iVar5;
  ulong __len;
  
  pMVar1 = J->mcarea;
  __len = (long)J->param[0xd] * 0x400 + 0xfffU & 0xfffffffffffff000;
  __addr = pMVar1 + -__len;
  if (pMVar1 == (MCode *)0x0) {
    __addr = (MCode *)0x0;
  }
  iVar5 = 0;
  do {
    if (__addr != (MCode *)0x0) {
      base = (long *)mmap64(__addr,__len,3,0x22,-1,0);
      if (1 < (long)base + 1U) {
        if (((long)base + (__len - 0x100000) < 0x3fe00000) || (0x100000U - (long)base < 0x3fe00000))
        {
          J->mcarea = (MCode *)base;
          J->szmcarea = __len;
          J->mcprot = 3;
          J->mctop = (MCode *)((long)base + __len);
          J->mcbot = (MCode *)(base + 2);
          *base = (long)pMVar1;
          base[1] = __len;
          J->szallmcarea = J->szallmcarea + __len;
          puVar4 = lj_err_register_mcode(base,__len,(uint8_t *)(base + 2));
          J->mcbot = puVar4;
          return;
        }
        munmap(base,__len);
      }
    }
    do {
      uVar2 = lj_prng_u64(&J->prng);
      uVar3 = (ulong)((uint)uVar2 & 0x7fff0000);
    } while (0x7fbfffff < uVar3 + __len);
    __addr = (MCode *)(uVar3 - 0x3fd00000);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x1f);
  lj_trace_err(J,LJ_TRERR_MCODEAL);
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
  J->mcbot = (MCode *)lj_err_register_mcode(J->mcarea, sz, (uint8_t *)J->mcbot);
}